

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_rr_ER(archive_write *a)

{
  int iVar1;
  uchar *__s;
  uchar *p;
  archive_write *a_local;
  
  __s = wb_buffptr(a);
  memset(__s,0,0x800);
  *__s = 'E';
  __s[1] = 'R';
  __s[3] = '\x01';
  __s[2] = 0xed;
  __s[4] = '\n';
  __s[5] = 'T';
  __s[6] = 0x87;
  __s[7] = '\x01';
  memcpy(__s + 8,"RRIP_1991A",(ulong)__s[4]);
  memcpy(__s + (int)(__s[4] + 8),
         "THE ROCK RIDGE INTERCHANGE PROTOCOL PROVIDES SUPPORT FOR POSIX FILE SYSTEM SEMANTICS",
         (ulong)__s[5]);
  memcpy(__s + (int)(__s[4] + 8 + (uint)__s[5]),
         "PLEASE CONTACT DISC PUBLISHER FOR SPECIFICATION SOURCE.  SEE PUBLISHER IDENTIFIER IN PRIMARY VOLUME DESCRIPTOR FOR CONTACT INFORMATION."
         ,(ulong)__s[6]);
  iVar1 = wb_consume(a,0x800);
  return iVar1;
}

Assistant:

static int
write_rr_ER(struct archive_write *a)
{
	unsigned char *p;

	p = wb_buffptr(a);

	memset(p, 0, LOGICAL_BLOCK_SIZE);
	p[0] = 'E';
	p[1] = 'R';
	p[3] = 0x01;
	p[2] = RRIP_ER_SIZE;
	p[4] = RRIP_ER_ID_SIZE;
	p[5] = RRIP_ER_DSC_SIZE;
	p[6] = RRIP_ER_SRC_SIZE;
	p[7] = 0x01;
	memcpy(&p[8], rrip_identifier, p[4]);
	memcpy(&p[8+p[4]], rrip_descriptor, p[5]);
	memcpy(&p[8+p[4]+p[5]], rrip_source, p[6]);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}